

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.h
# Opt level: O0

int __thiscall mpt::metatype::value<int>::convert(value<int> *this,type_t type,void *dest)

{
  bool bVar1;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 local_48 [8];
  value val;
  int type_meta;
  int ret;
  int type_val;
  void *dest_local;
  type_t type_local;
  value<int> *this_local;
  
  local_5c = type_properties<int>::id(true);
  if (type == 0) {
    local_54 = mpt::metatype::convert((ulong)this,(void *)0x0);
    if (0 < local_5c) {
      local_54 = local_5c;
    }
    this_local._4_4_ = local_54;
  }
  else {
    local_60 = type_properties<mpt::metatype::value<int>_*>::id(false);
    if (type == 0x100) {
      if (dest != (void *)0x0) {
        *(value<int> **)dest = this;
      }
      local_58 = local_60;
      if (local_60 < 1) {
        local_58 = 0x100;
      }
      this_local._4_4_ = local_58;
    }
    else if ((local_60 < 1) || (type != (long)local_60)) {
      if (local_5c < 1) {
        this_local._4_4_ = -3;
      }
      else if (type == (long)local_5c) {
        if (dest != (void *)0x0) {
          *(int *)dest = this->_val;
        }
        if (local_60 < 1) {
          local_60 = 0x100;
        }
        this_local._4_4_ = local_60;
      }
      else {
        val._type._4_4_ = local_60;
        mpt::value::value((value *)local_48);
        bVar1 = mpt::value::set((value *)local_48,local_5c,&this->_val);
        if (bVar1) {
          this_local._4_4_ = mpt::value::convert((ulong)local_48,(void *)type);
        }
        else {
          this_local._4_4_ = -3;
        }
      }
    }
    else {
      if (dest != (void *)0x0) {
        *(value<int> **)dest = this;
      }
      if (local_5c < 1) {
        local_5c = 0x100;
      }
      this_local._4_4_ = local_5c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int convert(type_t type, void *dest) __MPT_OVERRIDE
	{
		int type_val = type_properties<T>::id(true);
		if (!type) {
			int ret = metatype::convert(0, dest);
			return type_val > 0 ? type_val : ret;
		}
		int type_meta = type_properties<value<T> *>::id(false);
		if (type == TypeMetaPtr) {
			if (dest) {
				*static_cast<metatype **>(dest) = this;
			}
			return type_meta > 0 ? type_meta : static_cast<int>(TypeMetaPtr);
		}
		if (type_meta > 0 && type == static_cast<type_t>(type_meta)) {
			if (dest) {
				*static_cast<metatype **>(dest) = this;
			}
			return type_val > 0 ? type_val : static_cast<int>(TypeMetaPtr);
		}
		if (type_val > 0) {
			if (type == static_cast<type_t>(type_val)) {
				if (dest) {
					*static_cast<T *>(dest) = _val;
				}
				return type_meta > 0 ? type_meta : static_cast<int>(TypeMetaPtr);
			}
			::mpt::value val;
			if (!val.set(type_val, &_val)) {
				return BadType;
			}
			return val.convert(type, dest);
		}
		return BadType;
	}